

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

xmlEntityPtr xmlGetPredefinedEntity(xmlChar *name)

{
  xmlChar xVar1;
  int iVar2;
  
  if (name == (xmlChar *)0x0) {
    return (xmlEntityPtr)0x0;
  }
  xVar1 = *name;
  if (xVar1 == 'a') {
    iVar2 = xmlStrEqual(name,"amp");
    if (iVar2 != 0) {
      return &xmlEntityAmp;
    }
    iVar2 = xmlStrEqual(name,(xmlChar *)"apos");
    if (iVar2 != 0) {
      return &xmlEntityApos;
    }
  }
  else if (xVar1 == 'g') {
    iVar2 = xmlStrEqual(name,(xmlChar *)"gt");
    if (iVar2 != 0) {
      return &xmlEntityGt;
    }
  }
  else if (xVar1 == 'q') {
    iVar2 = xmlStrEqual(name,(xmlChar *)"quot");
    if (iVar2 != 0) {
      return &xmlEntityQuot;
    }
  }
  else if ((xVar1 == 'l') && (iVar2 = xmlStrEqual(name,"lt"), iVar2 != 0)) {
    return &xmlEntityLt;
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlGetPredefinedEntity(const xmlChar *name) {
    if (name == NULL) return(NULL);
    switch (name[0]) {
        case 'l':
	    if (xmlStrEqual(name, BAD_CAST "lt"))
	        return(&xmlEntityLt);
	    break;
        case 'g':
	    if (xmlStrEqual(name, BAD_CAST "gt"))
	        return(&xmlEntityGt);
	    break;
        case 'a':
	    if (xmlStrEqual(name, BAD_CAST "amp"))
	        return(&xmlEntityAmp);
	    if (xmlStrEqual(name, BAD_CAST "apos"))
	        return(&xmlEntityApos);
	    break;
        case 'q':
	    if (xmlStrEqual(name, BAD_CAST "quot"))
	        return(&xmlEntityQuot);
	    break;
	default:
	    break;
    }
    return(NULL);
}